

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix4f>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *result)

{
  bool bVar1;
  allocator local_f1;
  string local_f0;
  undefined1 local_cc [8];
  matrix4f value_1;
  char nc;
  char c;
  undefined1 local_68 [8];
  matrix4f value;
  vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value.m[3]._8_8_ = result;
  ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::clear
            (result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    tinyusdz::value::matrix4f::matrix4f((matrix4f *)local_68);
    bVar1 = ReadBasicType(this,(matrix4f *)local_68);
    if (bVar1) {
      ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
      push_back((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                value.m[3]._8_8_,(value_type *)local_68);
      while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        bVar1 = Char1(this,(char *)((long)value_1.m[3] + 10));
        if (!bVar1) {
          return false;
        }
        if (value_1.m[3][2]._2_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            return false;
          }
          bVar1 = LookChar1(this,(char *)((long)value_1.m[3] + 9));
          if (!bVar1) {
            return false;
          }
          if (value_1.m[3][2]._1_1_ == end_symbol) break;
        }
        if (value_1.m[3][2]._2_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          return false;
        }
        tinyusdz::value::matrix4f::matrix4f((matrix4f *)local_cc);
        bVar1 = ReadBasicType(this,(matrix4f *)local_cc);
        if (!bVar1) break;
        ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
        push_back((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                  value.m[3]._8_8_,(value_type *)local_cc);
      }
      bVar1 = ::std::vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>::
              empty((vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *
                    )value.m[3]._8_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_f0,"Empty array.\n",&local_f1);
        PushError(this,&local_f0);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(value_1.m[3] + 3),"Not starting with the value of requested type.\n",
                 (allocator *)((long)value_1.m[3] + 0xb));
      PushError(this,(string *)(value_1.m[3] + 3));
      ::std::__cxx11::string::~string((string *)(value_1.m[3] + 3));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)value_1.m[3] + 0xb));
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}